

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

int nghttp2_hd_deflate_init2
              (nghttp2_hd_deflater *deflater,size_t max_deflate_dynamic_table_size,nghttp2_mem *mem)

{
  int iVar1;
  
  iVar1 = hd_context_init(&deflater->ctx,mem);
  if (iVar1 == 0) {
    memset(&deflater->map,0,0x400);
    if (max_deflate_dynamic_table_size < 0x1000) {
      (deflater->ctx).hd_table_bufsize_max = max_deflate_dynamic_table_size;
    }
    deflater->notify_table_size_change = max_deflate_dynamic_table_size < 0x1000;
    deflater->deflate_hd_table_bufsize_max = max_deflate_dynamic_table_size;
    deflater->min_hd_table_bufsize_max = 0xffffffff;
  }
  return iVar1;
}

Assistant:

int nghttp2_hd_deflate_init2(nghttp2_hd_deflater *deflater,
                             size_t max_deflate_dynamic_table_size,
                             nghttp2_mem *mem) {
  int rv;
  rv = hd_context_init(&deflater->ctx, mem);
  if (rv != 0) {
    return rv;
  }

  hd_map_init(&deflater->map);

  if (max_deflate_dynamic_table_size < NGHTTP2_HD_DEFAULT_MAX_BUFFER_SIZE) {
    deflater->notify_table_size_change = 1;
    deflater->ctx.hd_table_bufsize_max = max_deflate_dynamic_table_size;
  } else {
    deflater->notify_table_size_change = 0;
  }

  deflater->deflate_hd_table_bufsize_max = max_deflate_dynamic_table_size;
  deflater->min_hd_table_bufsize_max = UINT32_MAX;

  return 0;
}